

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O1

void __thiscall slang::parsing::Preprocessor::Preprocessor(Preprocessor *this,Preprocessor *other)

{
  iterator __position;
  LanguageVersion LVar1;
  value_type_pointer ppcVar2;
  size_t sVar3;
  KeywordVersion local_52;
  allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>
  local_51;
  char *local_50;
  char *local_48;
  LexerOptions *local_40;
  PreprocessorOptions *local_38;
  
  this->sourceManager = other->sourceManager;
  this->alloc = other->alloc;
  this->diagnostics = other->diagnostics;
  local_38 = &this->options;
  PreprocessorOptions::PreprocessorOptions(local_38,&other->options);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  ::table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                *)&this->lexerOptions,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                *)&other->lexerOptions,&local_51);
  (this->lexerOptions).enableLegacyProtect = (other->lexerOptions).enableLegacyProtect;
  LVar1 = (other->lexerOptions).languageVersion;
  (this->lexerOptions).maxErrors = (other->lexerOptions).maxErrors;
  (this->lexerOptions).languageVersion = LVar1;
  (this->lexerStack).
  super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
  .data_ = (pointer)(this->lexerStack).
                    super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                    .firstElement;
  (this->lexerStack).
  super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
  .len = 0;
  (this->lexerStack).
  super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
  .cap = 2;
  local_48 = (this->branchStack).super_SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>.
             firstElement;
  (this->branchStack).super_SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>.data_ =
       (pointer)local_48;
  (this->branchStack).super_SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>.len = 0;
  (this->branchStack).super_SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>.cap = 2;
  (this->macros).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->macros).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
  .arrays.groups_size_mask = 1;
  (this->macros).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->macros).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->macros).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  sVar3 = 0x1d;
  if ((this->macros).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
      .arrays.elements_ == (value_type_pointer)0x0) {
    sVar3 = 0;
  }
  (this->macros).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
  .size_ctrl.ml = sVar3;
  (this->macros).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
  .size_ctrl.size = 0;
  local_50 = (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.firstElement;
  (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.data_ = (pointer)local_50;
  (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.len = 0;
  (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.cap = 2;
  this->currentMacroToken = (Token *)0x0;
  local_40 = &this->lexerOptions;
  Token::Token(&this->currentToken);
  Token::Token(&this->lastConsumed);
  this->inMacroBody = false;
  this->inIfDefCondition = false;
  (this->scratchTokenBuffer).super_SmallVectorBase<slang::parsing::Token>.data_ =
       (pointer)(this->scratchTokenBuffer).super_SmallVectorBase<slang::parsing::Token>.firstElement
  ;
  (this->scratchTokenBuffer).super_SmallVectorBase<slang::parsing::Token>.len = 0;
  (this->scratchTokenBuffer).super_SmallVectorBase<slang::parsing::Token>.cap = 2;
  (this->includeOnceHeaders).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
  .arrays.groups_size_index = 0x3f;
  (this->includeOnceHeaders).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
  .arrays.groups_size_mask = 1;
  (this->includeOnceHeaders).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->includeOnceHeaders).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->includeOnceHeaders).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  ppcVar2 = (this->includeOnceHeaders).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
            .arrays.elements_;
  sVar3 = 0x1d;
  if (ppcVar2 != (value_type_pointer)0x0) {
    ppcVar2 = (value_type_pointer)&DAT_0000001d;
  }
  (this->includeOnceHeaders).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
  .size_ctrl.ml = (size_t)ppcVar2;
  (this->activeTimeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScale>._M_engaged = false;
  (this->includeOnceHeaders).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
  .size_ctrl.size = 0;
  (this->keywordVersionStack).
  super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->keywordVersionStack).
  super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->keywordVersionStack).
  super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->defaultNetType = WireKeyword;
  this->unconnectedDrive = Unknown;
  this->cellDefine = false;
  this->designElementDepth = 0;
  this->includeDepth = 0;
  this->protectEncryptDepth = 0;
  this->protectDecryptDepth = 0;
  this->protectLineLength = 0;
  this->protectBytes = 0;
  this->protectEncoding = Raw;
  NumberParser::NumberParser
            (&this->numberParser,this->diagnostics,this->alloc,(this->options).languageVersion);
  (this->pragmaProtectHandlers).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->pragmaProtectHandlers).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
  .arrays.groups_size_mask = 1;
  (this->pragmaProtectHandlers).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->pragmaProtectHandlers).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->pragmaProtectHandlers).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  if ((this->pragmaProtectHandlers).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
      .arrays.elements_ == (value_type_pointer)0x0) {
    sVar3 = 0;
  }
  (this->pragmaProtectHandlers).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
  .size_ctrl.ml = sVar3;
  (this->pragmaProtectHandlers).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
  .size_ctrl.size = 0;
  local_52 = LexerFacts::getDefaultKeywordVersion((this->options).languageVersion);
  __position._M_current =
       (this->keywordVersionStack).
       super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->keywordVersionStack).
      super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>::
    _M_realloc_insert<slang::parsing::KeywordVersion>
              (&this->keywordVersionStack,__position,&local_52);
  }
  else {
    *__position._M_current = local_52;
    (this->keywordVersionStack).
    super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
    ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

Preprocessor::Preprocessor(const Preprocessor& other) :
    sourceManager(other.sourceManager), alloc(other.alloc), diagnostics(other.diagnostics),
    options(other.options), lexerOptions(other.lexerOptions),
    numberParser(diagnostics, alloc, options.languageVersion) {

    keywordVersionStack.push_back(LF::getDefaultKeywordVersion(options.languageVersion));
}